

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O1

int __thiscall OpenMD::Shake::constraintPairF(Shake *this,ConstraintPair *consPair)

{
  double *pdVar1;
  double dVar2;
  ConstraintElem *pCVar3;
  ConstraintElem *pCVar4;
  StuntDouble *pSVar5;
  uint i;
  int iVar6;
  long lVar7;
  double tmp;
  double dVar8;
  double tmp_2;
  double tmp_1;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_2;
  double local_148 [4];
  double local_128 [4];
  double local_108 [4];
  double local_e8;
  double local_e0;
  double local_d8 [4];
  Vector3d local_b8;
  double local_98 [4];
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58 [4];
  double local_38 [3];
  
  pCVar3 = consPair->consElem1_;
  pCVar4 = consPair->consElem2_;
  pSVar5 = pCVar3->sd_;
  lVar7 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar5->storage_);
  local_38[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar5->localIndex_ * 0x18);
  local_38[0] = *pdVar1;
  local_38[1] = pdVar1[1];
  pSVar5 = pCVar4->sd_;
  lVar7 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
  local_58[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar5->localIndex_ * 0x18);
  local_58[0] = *pdVar1;
  local_58[1] = pdVar1[1];
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  lVar7 = 0;
  do {
    local_128[lVar7] = local_38[lVar7] - local_58[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_b8.super_Vector<double,_3U>.data_[2] = local_128[2];
  local_b8.super_Vector<double,_3U>.data_[0] = local_128[0];
  local_b8.super_Vector<double,_3U>.data_[1] = local_128[1];
  Snapshot::wrapVector(this->currentSnapshot_,&local_b8);
  pSVar5 = pCVar3->sd_;
  lVar7 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar5->storage_);
  local_128[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar5->localIndex_ * 0x18);
  local_128[0] = *pdVar1;
  local_128[1] = pdVar1[1];
  pSVar5 = pCVar4->sd_;
  lVar7 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
  local_108[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar5->localIndex_ * 0x18);
  local_108[0] = *pdVar1;
  local_108[1] = pdVar1[1];
  local_e0 = 1.0 / pCVar3->sd_->mass_;
  local_e8 = pSVar5->mass_;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  lVar7 = 0;
  do {
    local_148[lVar7] = local_128[lVar7] * local_e0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_e8 = 1.0 / local_e8;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar7 = 0;
  do {
    local_98[lVar7] = local_108[lVar7] * local_e8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar7 = 0;
  do {
    local_d8[lVar7] = local_148[lVar7] - local_98[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar8 = 0.0;
  lVar7 = 0;
  do {
    dVar8 = dVar8 + local_d8[lVar7] * local_d8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_108[3] = 0.0;
  lVar7 = 0;
  do {
    dVar2 = local_b8.super_Vector<double,_3U>.data_[lVar7];
    local_108[3] = local_108[3] + dVar2 * dVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_68 = 0.0;
  lVar7 = 0;
  do {
    local_68 = local_68 + local_b8.super_Vector<double,_3U>.data_[lVar7] * local_d8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar2 = 1.0;
  if (1.0 <= dVar8) {
    dVar2 = dVar8;
  }
  local_78 = ABS(local_68);
  dVar2 = dVar2 * local_108[3];
  if (dVar2 < 0.0) {
    uStack_60 = 0;
    uStack_70 = 0;
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  iVar6 = 1;
  if (dVar2 * this->consTolerance_ < local_78) {
    dVar8 = -local_68 / ((local_e0 + local_e8) * local_108[3]);
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    local_148[2] = 0.0;
    lVar7 = 0;
    do {
      local_148[lVar7] = local_b8.super_Vector<double,_3U>.data_[lVar7] * dVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      local_128[lVar7] = local_148[lVar7] + local_128[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    local_148[2] = 0.0;
    lVar7 = 0;
    do {
      local_148[lVar7] = local_b8.super_Vector<double,_3U>.data_[lVar7] * dVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      local_108[lVar7] = local_108[lVar7] - local_148[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    pSVar5 = pCVar3->sd_;
    iVar6 = pSVar5->localIndex_;
    lVar7 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data + pSVar5->storage_);
    *(double *)(lVar7 + 0x10 + (long)iVar6 * 0x18) = local_128[2];
    pdVar1 = (double *)(lVar7 + (long)iVar6 * 0x18);
    *pdVar1 = local_128[0];
    pdVar1[1] = local_128[1];
    pSVar5 = pCVar4->sd_;
    iVar6 = pSVar5->localIndex_;
    lVar7 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
    *(double *)(lVar7 + 0x10 + (long)iVar6 * 0x18) = local_108[2];
    pdVar1 = (double *)(lVar7 + (long)iVar6 * 0x18);
    *pdVar1 = local_108[0];
    pdVar1[1] = local_108[1];
    consPair->force_ = dVar8;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Shake::constraintPairF(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    Vector3d frcA = consElem1->getFrc();
    Vector3d frcB = consElem2->getFrc();

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    Vector3d fpab = frcA * rma - frcB * rmb;

    RealType gab = fpab.lengthSquare();
    if (gab < 1.0) gab = 1.0;

    RealType rabsq = rab.lengthSquare();
    RealType rfab  = dot(rab, fpab);

    if (fabs(rfab) > sqrt(rabsq * gab) * consTolerance_) {
      gab = -rfab / (rabsq * (rma + rmb));

      frcA += rab * gab;
      frcB -= rab * gab;

      consElem1->setFrc(frcA);
      consElem2->setFrc(frcB);

      // report the constraint force back to the constraint pair:
      consPair->setConstraintForce(gab);
      return consSuccess;
    } else
      return consAlready;
  }